

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O2

void __thiscall CLIntercept::reportMDAPICounters(CLIntercept *this,ostream *os)

{
  long lVar1;
  long lVar2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  long lVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> headerWidths;
  string header;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((((this->m_Config).DevicePerfCounterTiming == true) &&
      ((this->m_Config).DevicePerfCounterEventBasedSampling == true)) &&
     ((this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    local_70 = local_60;
    local_68 = 0;
    local_60[0] = 0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var6 = (this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var3 = p_Var6[2]._M_right; p_Var3 != (_Base_ptr)&p_Var6[2]._M_parent;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 1),", ");
      std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      local_50._M_dataplus._M_p._0_4_ = *(undefined4 *)&p_Var3[1]._M_parent;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,(uint *)&local_50)
      ;
    }
    poVar4 = std::endl<char,std::char_traits<char>>(os);
    poVar4 = std::operator<<(poVar4,
                             "Device Performance Counter Timing: (Average metric per enqueue)");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(os,"                                FunctionName,  Calls, ");
    std::operator<<(poVar4,(string *)&local_70);
    for (p_Var6 = (this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      poVar4 = std::endl<char,std::char_traits<char>>(os);
      lVar7 = *(long *)poVar4;
      lVar1 = *(long *)(lVar7 + -0x18);
      *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar7 + -0x18) + 0x10) = 0x2c;
      poVar4 = std::operator<<(poVar4,(string *)(p_Var6 + 1));
      std::operator<<(poVar4,", ");
      lVar7 = *(long *)os;
      lVar1 = *(long *)(lVar7 + -0x18);
      *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(os + *(long *)(lVar7 + -0x18) + 0x10) = 6;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::operator<<(poVar4,", ");
      p_Var5 = p_Var6[2]._M_right;
      lVar7 = 0;
      while (p_Var5 != (_Rb_tree_node_base *)&p_Var6[2]._M_parent) {
        lVar1 = *(long *)os;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(long *)(os + *(long *)(lVar1 + -0x18) + 0x10) =
             (long)*(int *)((long)local_88._M_impl.super__Vector_impl_data._M_start + lVar7);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        std::operator<<(poVar4,", ");
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        lVar7 = lVar7 + 4;
      }
    }
    std::endl<char,std::char_traits<char>>(os);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void CLIntercept::reportMDAPICounters( std::ostream& os )
{
    if( config().DevicePerfCounterTiming &&
        config().DevicePerfCounterEventBasedSampling &&
        !m_MetricAggregations.empty() )
    {
        std::string header;
        std::vector<uint32_t> headerWidths;
        for( auto& metric : m_MetricAggregations.begin()->second )
        {
            const std::string& metricName = metric.first;

            header += metricName + ", ";
            headerWidths.push_back((uint32_t)metricName.length());
        }

        os << std::endl << "Device Performance Counter Timing: (Average metric per enqueue)" << std::endl;
        os << "                                FunctionName,  Calls, " << header;

        for( auto& metricsForKernel : m_MetricAggregations )
        {
            const std::string& kernelName = metricsForKernel.first;
            const MetricsDiscovery::CMetricAggregationsForKernel& kernelMetrics = metricsForKernel.second;

            uint64_t count = kernelMetrics.begin()->second.Count;
            os << std::endl << std::right << std::setw( 44 ) << kernelName << ", ";
            os << std::right << std::setw( 6 ) << count << ", ";

            int numMetric = 0;
            for( auto& metric : kernelMetrics )
            {
                const MetricsDiscovery::SMetricAggregationData& aggregationData = metric.second;
                os << std::right << std::setw( headerWidths[ numMetric++ ] );
                os << aggregationData.Sum / aggregationData.Count << ", ";
            }
        }

        os << std::endl;
    }
}